

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydata.h
# Opt level: O3

CutResult QtPrivate::QContainerImplHelper::mid
                    (qsizetype originalLength,qsizetype *_position,qsizetype *_length)

{
  CutResult CVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  lVar2 = *_position;
  uVar4 = originalLength - lVar2;
  if (originalLength < lVar2) {
    CVar1 = Null;
    *_position = 0;
    *_length = 0;
  }
  else {
    uVar3 = *_length;
    if (lVar2 < 0) {
      if (((long)uVar3 < 0) || (lVar2 = uVar3 + lVar2, originalLength <= lVar2)) {
        *_position = 0;
        *_length = originalLength;
        return Full;
      }
      if (lVar2 < 1) {
        *_length = 0;
        *_position = 0;
        return Null;
      }
      *_length = lVar2;
      *_position = 0;
      uVar3 = *_length;
    }
    else {
      if (uVar4 < uVar3) {
        *_length = uVar4;
        lVar2 = *_position;
        uVar3 = uVar4;
      }
      if (lVar2 != 0) goto LAB_00122fb4;
    }
    CVar1 = Full;
    if (uVar3 != originalLength) {
LAB_00122fb4:
      return (uint)(0 < (long)uVar3) * 2 + Empty;
    }
  }
  return CVar1;
}

Assistant:

static constexpr CutResult mid(qsizetype originalLength, qsizetype *_position, qsizetype *_length)
    {
        qsizetype &position = *_position;
        qsizetype &length = *_length;
        if (position > originalLength) {
            position = 0;
            length = 0;
            return Null;
        }

        if (position < 0) {
            if (length < 0 || length + position >= originalLength) {
                position = 0;
                length = originalLength;
                return Full;
            }
            if (length + position <= 0) {
                position = length = 0;
                return Null;
            }
            length += position;
            position = 0;
        } else if (size_t(length) > size_t(originalLength - position)) {
            length = originalLength - position;
        }

        if (position == 0 && length == originalLength)
            return Full;

        return length > 0 ? Subset : Empty;
    }